

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

parser * init_parse_player_timed(void)

{
  parser *p;
  void *v;
  
  p = parser_new();
  v = mem_zalloc(0x10);
  parser_setpriv(p,v);
  parser_reg(p,"name str name",parse_player_timed_name);
  parser_reg(p,"desc str text",parse_player_timed_desc);
  parser_reg(p,"on-end str text",parse_player_timed_end_message);
  parser_reg(p,"on-increase str text",parse_player_timed_increase_message);
  parser_reg(p,"on-decrease str text",parse_player_timed_decrease_message);
  parser_reg(p,"msgt sym type",parse_player_timed_message_type);
  parser_reg(p,"fail uint code str flag",parse_player_timed_fail);
  parser_reg(p,"grade sym color int max sym name sym up_msg ?sym down_msg",parse_player_timed_grade)
  ;
  parser_reg(p,"resist sym elem",parse_player_timed_resist);
  parser_reg(p,"brand sym name",parse_player_timed_brand);
  parser_reg(p,"slay sym name",parse_player_timed_slay);
  parser_reg(p,"flag-synonym sym code int exact",parse_player_timed_flag_synonym);
  parser_reg(p,"on-begin-effect sym eff ?sym type ?int radius ?int other",
             parse_player_timed_on_begin_effect);
  parser_reg(p,"on-end-effect sym eff ?sym type ?int radius ?int other",
             parse_player_timed_on_end_effect);
  parser_reg(p,"effect-yx int y int x",parse_player_timed_effect_yx);
  parser_reg(p,"effect-dice str dice",parse_player_timed_effect_dice);
  parser_reg(p,"effect-expr sym name sym base str expr",parse_player_timed_effect_expr);
  parser_reg(p,"effect-msg str text",parse_player_timed_effect_msg);
  parser_reg(p,"flags ?str flags",parse_player_timed_effect_flags);
  parser_reg(p,"lower-bound int bound",parse_player_timed_effect_lower_bound);
  return p;
}

Assistant:

static struct parser *init_parse_player_timed(void)
{
	struct parser *p = parser_new();
	struct timed_effect_parse_state *ps = mem_zalloc(sizeof(*ps));

	parser_setpriv(p, ps);
	parser_reg(p, "name str name", parse_player_timed_name);
	parser_reg(p, "desc str text", parse_player_timed_desc);
	parser_reg(p, "on-end str text", parse_player_timed_end_message);
	parser_reg(p, "on-increase str text", parse_player_timed_increase_message);
	parser_reg(p, "on-decrease str text", parse_player_timed_decrease_message);
	parser_reg(p, "msgt sym type", parse_player_timed_message_type);
	parser_reg(p, "fail uint code str flag", parse_player_timed_fail);
	parser_reg(p, "grade sym color int max sym name sym up_msg ?sym down_msg", parse_player_timed_grade);
	parser_reg(p, "resist sym elem", parse_player_timed_resist);
	parser_reg(p, "brand sym name", parse_player_timed_brand);
	parser_reg(p, "slay sym name", parse_player_timed_slay);
	parser_reg(p, "flag-synonym sym code int exact",
		parse_player_timed_flag_synonym);
	parser_reg(p,
		"on-begin-effect sym eff ?sym type ?int radius ?int other",
		parse_player_timed_on_begin_effect);
	parser_reg(p,
		"on-end-effect sym eff ?sym type ?int radius ?int other",
		parse_player_timed_on_end_effect);
	parser_reg(p, "effect-yx int y int x", parse_player_timed_effect_yx);
	parser_reg(p, "effect-dice str dice", parse_player_timed_effect_dice);
	parser_reg(p, "effect-expr sym name sym base str expr",
		parse_player_timed_effect_expr);
	parser_reg(p, "effect-msg str text", parse_player_timed_effect_msg);
	parser_reg(p, "flags ?str flags", parse_player_timed_effect_flags);
	parser_reg(p, "lower-bound int bound",
		parse_player_timed_effect_lower_bound);
	return p;
}